

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O3

JSONNode __thiscall JSONNode::as_node(JSONNode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  size_t *psVar3;
  internalJSONNode *piVar4;
  long *in_RSI;
  size_type __dnew;
  size_type local_50;
  json_string local_48;
  
  lVar2 = *in_RSI;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"no internal","");
  JSONDebug::_JSON_ASSERT(lVar2 != 0,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
  local_48.field_2._7_4_ = 0x6c616e72;
  local_48._M_string_length = 0xb;
  local_48.field_2._M_local_buf[0xb] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  JSONDebug::_JSON_ASSERT(*in_RSI != 0,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  piVar4 = (internalJSONNode *)*in_RSI;
  if (piVar4->_type == '\x05') {
    piVar4->refcount = piVar4->refcount + 1;
    this->internal = piVar4;
    psVar3 = getCopyCtorCounter();
  }
  else {
    local_48.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
    local_48.field_2._7_4_ = 0x6c616e72;
    local_48._M_string_length = 0xb;
    local_48.field_2._M_local_buf[0xb] = '\0';
    local_48._M_dataplus._M_p = (pointer)paVar1;
    JSONDebug::_JSON_ASSERT(true,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (*(char *)*in_RSI == '\x04') {
      duplicate(this);
      this->internal->_type = '\x05';
      return (JSONNode)(internalJSONNode *)this;
    }
    piVar4 = internalJSONNode::newInternal('\x05');
    this->internal = piVar4;
    local_50 = 0x16;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    local_48._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
    local_48.field_2._M_allocated_capacity._0_7_ = (undefined7)local_50;
    local_48.field_2._M_local_buf[7] = (char)(local_50 >> 0x38);
    builtin_strncpy(local_48._M_dataplus._M_p,"Not a proper JSON type",0x16);
    local_48._M_string_length = local_50;
    local_48._M_dataplus._M_p[local_50] = '\0';
    JSONDebug::_JSON_ASSERT(true,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    psVar3 = getCtorCounter();
  }
  *psVar3 = *psVar3 + 1;
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode JSONNode::as_node(void) const json_nothrow {
	   JSON_CHECK_INTERNAL();
	   if (type() == JSON_NODE){
		  return *this;
	   } else if (type() == JSON_ARRAY){
		  JSONNode res(duplicate());
		  res.internal -> _type = JSON_NODE;
		  return res;
	   }
	   #ifdef JSON_MUTEX_CALLBACKS
		  if (internal -> mylock != 0){
			 JSONNode res(JSON_NODE);
			 res.set_mutex(internal -> mylock);
			 return res;
		  }
	   #endif
	   return JSONNode(JSON_NODE);
    }